

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall crnd::crn_unpacker::decode_alpha_endpoints(crn_unpacker *this)

{
  uint8 *puVar1;
  bool bVar2;
  uint uVar3;
  uint buf_size;
  uint32 uVar4;
  uint local_6c;
  uint local_68;
  uint32 i;
  uint32 b;
  uint32 a;
  uint16 *pDst;
  undefined1 local_48 [8];
  static_huffman_data_model dm;
  uint32 num_alpha_endpoints;
  crn_unpacker *this_local;
  
  dm.m_pDecode_tables._4_4_ =
       crn_packed_uint::operator_cast_to_unsigned_int
                 ((crn_packed_uint *)&(this->m_pHeader->m_alpha_endpoints).m_num);
  puVar1 = this->m_pData;
  uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                    ((crn_packed_uint *)&this->m_pHeader->m_alpha_endpoints);
  buf_size = crn_packed_uint::operator_cast_to_unsigned_int
                       ((crn_packed_uint *)&(this->m_pHeader->m_alpha_endpoints).m_size);
  bVar2 = symbol_codec::start_decoding(&this->m_codec,puVar1 + uVar3,buf_size);
  if (bVar2) {
    static_huffman_data_model::static_huffman_data_model((static_huffman_data_model *)local_48);
    bVar2 = symbol_codec::decode_receive_static_data_model
                      (&this->m_codec,(static_huffman_data_model *)local_48);
    if (bVar2) {
      bVar2 = vector<unsigned_short>::resize(&this->m_alpha_endpoints,dm.m_pDecode_tables._4_4_);
      if (bVar2) {
        _b = vector<unsigned_short>::operator[](&this->m_alpha_endpoints,0);
        i = 0;
        local_68 = 0;
        for (local_6c = 0; local_6c < dm.m_pDecode_tables._4_4_; local_6c = local_6c + 1) {
          uVar4 = symbol_codec::decode(&this->m_codec,(static_huffman_data_model *)local_48);
          i = i + uVar4 & 0xff;
          uVar4 = symbol_codec::decode(&this->m_codec,(static_huffman_data_model *)local_48);
          local_68 = local_68 + uVar4 & 0xff;
          *_b = (ushort)i | (ushort)(local_68 << 8);
          _b = _b + 1;
        }
        symbol_codec::stop_decoding(&this->m_codec);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)local_48);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool decode_alpha_endpoints() {
    const uint32 num_alpha_endpoints = m_pHeader->m_alpha_endpoints.m_num;

    if (!m_codec.start_decoding(m_pData + m_pHeader->m_alpha_endpoints.m_ofs, m_pHeader->m_alpha_endpoints.m_size))
      return false;

    static_huffman_data_model dm;
    if (!m_codec.decode_receive_static_data_model(dm))
      return false;

    if (!m_alpha_endpoints.resize(num_alpha_endpoints))
      return false;

    uint16* CRND_RESTRICT pDst = &m_alpha_endpoints[0];
    uint32 a = 0, b = 0;

    for (uint32 i = 0; i < num_alpha_endpoints; i++) {
      a = (a + m_codec.decode(dm)) & 255;
      b = (b + m_codec.decode(dm)) & 255;
      *pDst++ = (uint16)(a | (b << 8));
    }

    m_codec.stop_decoding();

    return true;
  }